

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O1

string * __thiscall
slack::_detail::join<std::__cxx11::string>
          (string *__return_storage_ptr__,_detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec,string *sep)

{
  undefined8 *puVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  puVar1 = *(undefined8 **)this;
  if (*(undefined8 **)(this + 8) == puVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)*puVar1,puVar1[1]);
    if (0x20 < (ulong)(*(long *)(this + 8) - *(long *)this)) {
      uVar4 = 1;
      lVar3 = 0x28;
      do {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,
                            (char *)(vec->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                            (long)(vec->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,*(char **)(*(long *)this + -8 + lVar3),*(long *)(*(long *)this + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5));
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string join(const std::vector<T>& vec, const std::string& sep) {
    std::stringstream ss;
    if (vec.size() == 0) { return ""; };
    ss << vec[0];
    for (size_t i = 1; i < vec.size(); i ++) { ss << sep << vec[i]; }
    return ss.str();
}